

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLException::loadExceptText
          (XMLException *this,Codes toLoad,XMLCh *text1,XMLCh *text2,XMLCh *text3,XMLCh *text4)

{
  uint uVar1;
  XMLMsgLoader *pXVar2;
  XMLCh *pXVar3;
  XMLCh local_2048 [4];
  XMLCh errText [4096];
  XMLSize_t msgSize;
  XMLCh *text4_local;
  XMLCh *text3_local;
  XMLCh *text2_local;
  XMLCh *text1_local;
  Codes toLoad_local;
  XMLException *this_local;
  
  this->fCode = toLoad;
  errText[0xffc] = L'࿿';
  errText[0xffd] = L'\0';
  errText[0xffe] = L'\0';
  errText[0xfff] = L'\0';
  pXVar2 = gGetMsgLoader();
  uVar1 = (*pXVar2->_vptr_XMLMsgLoader[3])
                    (pXVar2,(ulong)toLoad,local_2048,0xfff,text1,text2,text3,text4,
                     this->fMemoryManager);
  if ((uVar1 & 1) == 0) {
    pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgDefErrMsg,this->fMemoryManager);
    this->fMsg = pXVar3;
  }
  else {
    pXVar3 = XMLString::replicate(local_2048,this->fMemoryManager);
    this->fMsg = pXVar3;
  }
  return;
}

Assistant:

void
XMLException::loadExceptText(const  XMLExcepts::Codes toLoad
                            , const XMLCh* const        text1
                            , const XMLCh* const        text2
                            , const XMLCh* const        text3
                            , const XMLCh* const        text4)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 4095;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize, text1, text2, text3, text4, fMemoryManager))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}